

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

int32_t __thiscall llama_kv_cache_unified::get_n_tokens(llama_kv_cache_unified *this)

{
  size_type sVar1;
  long in_RDI;
  uint32_t i;
  int32_t result;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0x6c); local_10 = local_10 + 1) {
    std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
              ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x78),
               (ulong)local_10);
    sVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)0x440a5e);
    local_c = local_c + (int)sVar1;
  }
  return local_c;
}

Assistant:

int32_t llama_kv_cache_unified::get_n_tokens() const {
    int32_t result = 0;

    for (uint32_t i = 0; i < size; i++) {
        result += cells[i].seq_id.size();
    }

    return result;
}